

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# benchmark-loop-count.c
# Opt level: O0

int run_benchmark_loop_count_timed(void)

{
  int iVar1;
  uv_loop_t *puVar2;
  undefined1 auVar3 [16];
  uv_loop_t *loop;
  
  puVar2 = uv_default_loop();
  uv_idle_init(puVar2,&idle_handle);
  uv_idle_start(&idle_handle,idle2_cb);
  uv_timer_init(puVar2,&timer_handle);
  uv_timer_start(&timer_handle,timer_cb,5000,0);
  uv_run(puVar2,UV_RUN_DEFAULT);
  auVar3._8_4_ = (int)(ticks >> 0x20);
  auVar3._0_8_ = ticks;
  auVar3._12_4_ = 0x45300000;
  fprintf(_stderr,"loop_count: %lu ticks (%.0f ticks/s)\n",
          ((auVar3._8_8_ - 1.9342813113834067e+25) +
          ((double)CONCAT44(0x43300000,(int)ticks) - 4503599627370496.0)) / 5.0);
  fflush(_stderr);
  puVar2 = uv_default_loop();
  close_loop(puVar2);
  puVar2 = uv_default_loop();
  iVar1 = uv_loop_close(puVar2);
  if (iVar1 != 0) {
    fprintf(_stderr,"Assertion failed in %s on line %d: %s\n",
            "/workspace/llm4binary/github/license_all_cmakelists_25/neovim[P]libuv/test/benchmark-loop-count.c"
            ,0x5a,"0 == uv_loop_close(uv_default_loop())");
    abort();
  }
  uv_library_shutdown();
  return 0;
}

Assistant:

BENCHMARK_IMPL(loop_count_timed) {
  uv_loop_t* loop = uv_default_loop();

  uv_idle_init(loop, &idle_handle);
  uv_idle_start(&idle_handle, idle2_cb);

  uv_timer_init(loop, &timer_handle);
  uv_timer_start(&timer_handle, timer_cb, 5000, 0);

  uv_run(loop, UV_RUN_DEFAULT);

  fprintf(stderr, "loop_count: %lu ticks (%.0f ticks/s)\n", ticks, ticks / 5.0);
  fflush(stderr);

  MAKE_VALGRIND_HAPPY();
  return 0;
}